

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2c.cc
# Opt level: O0

int ProgramMain(int argc,char **argv)

{
  FILE *file;
  Enum EVar1;
  string local_60;
  Enum local_3c;
  undefined1 local_38 [8];
  Errors errors;
  Result result;
  char **argv_local;
  int argc_local;
  
  wabt::Result::Result
            ((Result *)
             ((long)&errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  wabt::InitStdio();
  ParseOptions(argc,argv);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)local_38);
  local_3c = (Enum)Wasm2cMain((Errors *)local_38);
  file = _stderr;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = (Result)local_3c;
  std::__cxx11::string::string((string *)&local_60);
  wabt::FormatErrorsToFile
            ((Errors *)local_38,Binary,(LexerSourceLineFinder *)0x0,file,&local_60,Never,0x50);
  std::__cxx11::string::~string((string *)&local_60);
  EVar1 = wabt::Result::operator_cast_to_Enum
                    ((Result *)
                     ((long)&errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)local_38);
  return (uint)(EVar1 != Ok);
}

Assistant:

int ProgramMain(int argc, char** argv) {
  Result result;

  InitStdio();
  ParseOptions(argc, argv);

  Errors errors;
  result = Wasm2cMain(errors);
  FormatErrorsToFile(errors, Location::Type::Binary);

  return result != Result::Ok;
}